

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O3

value * mjs::json_parse(value *__return_storage_ptr__,gc_heap_ptr<mjs::global_object> *global,
                       vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  value *v;
  value *pvVar1;
  pointer pvVar2;
  wstring_view name;
  bool bVar3;
  uint *puVar4;
  ulong uVar5;
  long *plVar6;
  long *plVar7;
  wchar_t *pwVar8;
  object_ptr holder;
  json_lexer lex;
  value val;
  gc_heap *pgVar9;
  undefined8 in_stack_ffffffffffffff00;
  undefined1 local_f8 [32];
  _Any_data local_d8;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *local_c8 [2];
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_b8;
  pointer local_a8;
  int local_a0;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *local_98;
  pointer local_90;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_88;
  undefined8 local_78;
  gc_heap_ptr_untyped local_70;
  undefined1 local_60 [48];
  
  v = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_start;
  pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (v == pvVar1) {
    pwVar8 = L"undefined";
    uVar5 = 9;
  }
  else {
    to_string((mjs *)&local_70,(global->super_gc_heap_ptr_untyped).heap_,v);
    puVar4 = (uint *)gc_heap_ptr_untyped::get(&local_70);
    pwVar8 = (wchar_t *)(puVar4 + 1);
    uVar5 = (ulong)*puVar4;
  }
  pgVar9 = (gc_heap *)local_f8;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&stack0xfffffffffffffef8,pwVar8,pwVar8 + uVar5);
  local_d8._M_unused._M_object = (global->super_gc_heap_ptr_untyped).heap_;
  local_d8._8_4_ = (global->super_gc_heap_ptr_untyped).pos_;
  if ((gc_heap *)local_d8._M_unused._0_8_ != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_d8._M_unused._0_8_,(gc_heap_ptr_untyped *)&local_d8);
  }
  std::__cxx11::wstring::wstring((wstring *)local_c8,(wstring *)&stack0xfffffffffffffef8);
  local_a8 = (pointer)0x0;
  local_a0 = 0xc;
  local_98 = &local_88;
  local_90 = (pointer)0x0;
  local_88._M_local_buf[0] = L'\0';
  local_78 = 0;
  anon_unknown_46::json_lexer::next_token((json_token *)local_60,(json_lexer *)&local_d8);
  if ((gc_heap *)local_60._8_8_ != (gc_heap *)(local_60 + 0x18)) {
    operator_delete((void *)local_60._8_8_,local_60._24_8_ * 4 + 4);
  }
  if (pgVar9 != (gc_heap *)local_f8) {
    operator_delete(pgVar9,local_f8._0_8_ * 4 + 4);
  }
  if (v != pvVar1) {
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_70);
  }
  anon_unknown_46::json_parse_value((value *)local_60,(json_lexer *)&local_d8);
  anon_unknown_46::json_lexer::skip_whitespace((json_lexer *)&local_d8);
  if (local_a0 != 0xc) {
    anon_unknown_46::json_lexer::throw_unexpected((json_lexer *)&local_d8);
  }
  pvVar2 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((1 < (ulong)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
                  -0x3333333333333333)) && (pvVar2[1].type_ == object)) {
    bVar3 = gc_heap_ptr_untyped::has_type<mjs::function_object>
                      ((gc_heap_ptr_untyped *)&pvVar2[1].field_1.s_);
    if (bVar3) {
      gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
      global_object::make_object((global_object *)&stack0xfffffffffffffef8);
      plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&stack0xfffffffffffffef8);
      plVar7 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
      (**(code **)(*plVar7 + 0x98))(local_f8 + 0x10,plVar7,"");
      (**(code **)(*plVar6 + 8))(plVar6,local_f8 + 0x10,local_60,0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_f8 + 0x10));
      name._M_str = (wchar_t *)in_stack_ffffffffffffff00;
      name._M_len = (size_t)pgVar9;
      anon_unknown_46::json_walk
                (__return_storage_ptr__,(anon_unknown_46 *)global,
                 (gc_heap_ptr<mjs::global_object> *)
                 ((args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                  super__Vector_impl_data._M_start + 1),(value *)&stack0xfffffffffffffef8,
                 (object_ptr *)0x0,name);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xfffffffffffffef8);
      goto LAB_0015de8f;
    }
  }
  value::value(__return_storage_ptr__,(value *)local_60);
LAB_0015de8f:
  value::destroy((value *)local_60);
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT44(local_88._M_local_buf[1],local_88._M_local_buf[0]) * 4 + 4);
  }
  if (local_c8[0] != &local_b8) {
    operator_delete(local_c8[0],local_b8._M_allocated_capacity * 4 + 4);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_d8);
  return __return_storage_ptr__;
}

Assistant:

value json_parse(const gc_heap_ptr<global_object>& global, const std::vector<value>& args) {
    json_lexer lex{global, std::wstring{args.empty() ? L"undefined" : to_string(global.heap(), args.front()).view()}};
    value val = json_parse_value(lex);
    lex.skip_whitespace();
    if (!lex.eof()) {
        lex.throw_unexpected();
    }
    if (args.size() > 1 && args[1].type() == value_type::object && args[1].object_value().has_type<function_object>()) {
        auto holder = global->make_object();
        holder->put(global->common_string(""), val);
        return json_walk(global, args[1], holder, L"");
    }
    return val;
}